

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *this;
  int iVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  char *pcVar5;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar6;
  long lVar7;
  char local_29;
  
  pIVar3 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  this = &pIVar3->SettingsIniData;
  ImVector<char>::resize(&this->Buf,0);
  local_29 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_29);
  pIVar6 = (pIVar3->SettingsHandlers).Data;
  for (lVar7 = (long)(pIVar3->SettingsHandlers).Size * 0x48; lVar7 != 0; lVar7 = lVar7 + -0x48) {
    (*pIVar6->WriteAllFn)(pIVar3,pIVar6,this);
    pIVar6 = pIVar6 + 1;
  }
  if (out_size != (size_t *)0x0) {
    iVar1 = (this->Buf).Size;
    iVar4 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar4 = 0;
    }
    *out_size = (long)iVar4;
  }
  pcVar2 = (pIVar3->SettingsIniData).Buf.Data;
  pcVar5 = ImGuiTextBuffer::EmptyString;
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  return pcVar5;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        handler.WriteAllFn(&g, &handler, &g.SettingsIniData);
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}